

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_getcwd(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  size_t sVar2;
  anon_union_8_3_2f476f46_for_data aVar3;
  _func_int **__dest;
  ulong __n;
  char buf [1024];
  Value local_428;
  char local_418 [1024];
  
  getcwd(local_418,0x400);
  sVar2 = strlen(local_418);
  if (sVar2 == 0) {
    aVar3.number = 0.0;
  }
  else {
    aVar3.ref = (RefCountedStorage *)operator_new(0x30);
    __n = sVar2 + 1;
    (aVar3.ref)->refCount = 1;
    (aVar3.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar3.ref[1].refCount = __n;
    aVar3.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    __dest = (_func_int **)operator_new__(__n);
    aVar3.ref[1]._vptr_RefCountedStorage = __dest;
    memcpy(__dest,local_418,__n);
  }
  local_428.type = String;
  local_428.noInvoke = false;
  local_428.localOnly = Off;
  local_428.data = aVar3;
  if (aVar3.ref == (RefCountedStorage *)0x0) {
    local_428.data = DAT_001c1308;
  }
  if (local_428.data.ref != (RefCountedStorage *)0x0) {
    (local_428.data.ref)->refCount = (local_428.data.ref)->refCount + 1;
  }
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  MiniScript::Value::operator=
            ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
             &local_428);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_428.type) && (local_428.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_428.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_428.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_428.data.number = 0.0;
  }
  if (aVar3.ref != (RefCountedStorage *)0x0) {
    plVar1 = &(aVar3.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(aVar3.ref)->_vptr_RefCountedStorage[1])(aVar3.number);
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_getcwd(Context *context, IntrinsicResult partialResult) {
	char buf[1024];
	getcwd(buf, sizeof(buf));
	return IntrinsicResult(String(buf));
}